

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-opcodecnt.cc
# Opt level: O2

void WriteCounts(Stream *stream,OpcodeInfoCounts *info_counts)

{
  long lVar1;
  unsigned_long uVar2;
  pointer ppVar3;
  mapped_type *pmVar4;
  _Base_ptr p_Var5;
  char *pcVar6;
  pair<wabt::Opcode,_unsigned_long> *pair;
  pointer ppVar7;
  Opcode opcode_1;
  vector<std::pair<wabt::Opcode,_unsigned_long>,_std::allocator<std::pair<wabt::Opcode,_unsigned_long>_>_>
  sorted;
  map<wabt::Opcode,_unsigned_long,_std::less<wabt::Opcode>,_std::allocator<std::pair<const_wabt::Opcode,_unsigned_long>_>_>
  counts;
  Opcode local_7c;
  _Vector_base<std::pair<wabt::Opcode,_unsigned_long>,_std::allocator<std::pair<wabt::Opcode,_unsigned_long>_>_>
  local_78;
  _Rb_tree<wabt::Opcode,_std::pair<const_wabt::Opcode,_unsigned_long>,_std::_Select1st<std::pair<const_wabt::Opcode,_unsigned_long>_>,_std::less<wabt::Opcode>,_std::allocator<std::pair<const_wabt::Opcode,_unsigned_long>_>_>
  local_60;
  
  local_60._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_60._M_impl.super__Rb_tree_header._M_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_60._M_impl.super__Rb_tree_header._M_header._M_right =
       local_60._M_impl.super__Rb_tree_header._M_header._M_left;
  for (p_Var5 = (info_counts->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var5 != &(info_counts->_M_t)._M_impl.super__Rb_tree_header;
      p_Var5 = (_Base_ptr)std::_Rb_tree_increment(p_Var5)) {
    local_78._M_impl.super__Vector_impl_data._M_start =
         (pointer)CONCAT44(local_78._M_impl.super__Vector_impl_data._M_start._4_4_,
                           p_Var5[1]._M_color);
    lVar1 = *(long *)(p_Var5 + 2);
    pmVar4 = std::
             map<wabt::Opcode,_unsigned_long,_std::less<wabt::Opcode>,_std::allocator<std::pair<const_wabt::Opcode,_unsigned_long>_>_>
             ::operator[]((map<wabt::Opcode,_unsigned_long,_std::less<wabt::Opcode>,_std::allocator<std::pair<const_wabt::Opcode,_unsigned_long>_>_>
                           *)&local_60,(key_type *)&local_78);
    *pmVar4 = *pmVar4 + lVar1;
  }
  local_78._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_78._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_78._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  copy_if<std::_Rb_tree_iterator<std::pair<wabt::Opcode_const,unsigned_long>>,std::back_insert_iterator<std::vector<std::pair<wabt::Opcode,unsigned_long>,std::allocator<std::pair<wabt::Opcode,unsigned_long>>>>,WithinCutoff<std::pair<wabt::Opcode,unsigned_long>>>
            (local_60._M_impl.super__Rb_tree_header._M_header._M_left,
             &local_60._M_impl.super__Rb_tree_header,&local_78);
  std::
  __stable_sort<__gnu_cxx::__normal_iterator<std::pair<wabt::Opcode,unsigned_long>*,std::vector<std::pair<wabt::Opcode,unsigned_long>,std::allocator<std::pair<wabt::Opcode,unsigned_long>>>>,__gnu_cxx::__ops::_Iter_comp_iter<SortByCountDescending<std::pair<wabt::Opcode,unsigned_long>>>>
            (local_78._M_impl.super__Vector_impl_data._M_start,
             local_78._M_impl.super__Vector_impl_data._M_finish);
  ppVar3 = local_78._M_impl.super__Vector_impl_data._M_finish;
  for (ppVar7 = local_78._M_impl.super__Vector_impl_data._M_start; ppVar7 != ppVar3;
      ppVar7 = ppVar7 + 1) {
    local_7c.enum_ = (ppVar7->first).enum_;
    uVar2 = ppVar7->second;
    pcVar6 = wabt::Opcode::GetName(&local_7c);
    wabt::Stream::Writef(stream,"%s%s%zd\n",pcVar6,s_separator,uVar2);
  }
  std::
  _Vector_base<std::pair<wabt::Opcode,_unsigned_long>,_std::allocator<std::pair<wabt::Opcode,_unsigned_long>_>_>
  ::~_Vector_base(&local_78);
  std::
  _Rb_tree<wabt::Opcode,_std::pair<const_wabt::Opcode,_unsigned_long>,_std::_Select1st<std::pair<const_wabt::Opcode,_unsigned_long>_>,_std::less<wabt::Opcode>,_std::allocator<std::pair<const_wabt::Opcode,_unsigned_long>_>_>
  ::~_Rb_tree(&local_60);
  return;
}

Assistant:

void WriteCounts(Stream& stream, const OpcodeInfoCounts& info_counts) {
  typedef std::pair<Opcode, size_t> OpcodeCountPair;

  std::map<Opcode, size_t> counts;
  for (auto& info_count_pair: info_counts) {
    Opcode opcode = info_count_pair.first.opcode();
    size_t count = info_count_pair.second;
    counts[opcode] += count;
  }

  std::vector<OpcodeCountPair> sorted;
  std::copy_if(counts.begin(), counts.end(), std::back_inserter(sorted),
               WithinCutoff<OpcodeCountPair>());

  // Use a stable sort to keep the elements with the same count in opcode
  // order (since the Opcode map is sorted).
  std::stable_sort(sorted.begin(), sorted.end(),
                   SortByCountDescending<OpcodeCountPair>());

  for (auto& pair : sorted) {
    Opcode opcode = pair.first;
    size_t count = pair.second;
    stream.Writef("%s%s%" PRIzd "\n", opcode.GetName(), s_separator, count);
  }
}